

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void ** __thiscall
google::protobuf::Reflection::MutableSplitField(Reflection *this,Message *message)

{
  uint32_t uVar1;
  LogMessageFatal LStack_18;
  
  if ((this->schema_).split_offset_ != -1) {
    uVar1 = internal::ReflectionSchema::SplitOffset(&this->schema_);
    return (void **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x64e,"schema_.IsSplit()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

const To* GetConstPointerAtOffset(const void* message, uint32_t offset) {
  return reinterpret_cast<const To*>(reinterpret_cast<const char*>(message) +
                                     offset);
}